

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTransformers.cpp
# Opt level: O3

void iDynTree::reducedModelAddSolidShapes
               (Model *fullModel,Model *reducedModel,string *linkInReducedModel,
               Traversal *linkSubModel,FreeFloatingPos *pos,LinkPositions *subModelBase_X_link)

{
  vector<iDynTree::SolidShape*,std::allocator<iDynTree::SolidShape*>> *pvVar1;
  pointer pvVar2;
  iterator iVar3;
  SolidShape *pSVar4;
  uint uVar5;
  int iVar6;
  LinkIndex LVar7;
  Link *this;
  Transform *pTVar8;
  ModelSolidShapes *pMVar9;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *pvVar10;
  undefined4 extraout_var;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *pvVar11;
  pointer ppSVar12;
  undefined4 extraout_var_00;
  ulong uVar13;
  SolidShape *copiedShape;
  Transform subModelBase_H_visitedLink;
  Transform visitedLink_H_shape;
  SolidShape *local_188;
  Model *local_180;
  long local_178;
  Model *local_170;
  Traversal *local_168;
  LinkPositions *local_160;
  ulong local_158;
  Transform local_150 [96];
  Transform local_f0 [96];
  Transform local_90 [96];
  
  local_180 = fullModel;
  local_170 = reducedModel;
  local_160 = subModelBase_X_link;
  LVar7 = Model::getLinkIndex(reducedModel,linkInReducedModel);
  uVar5 = Traversal::getNrOfVisitedLinks(linkSubModel);
  if (uVar5 != 0) {
    uVar13 = 0;
    local_178 = LVar7 * 3;
    local_168 = linkSubModel;
    do {
      this = Traversal::getLink(linkSubModel,uVar13);
      local_158 = uVar13;
      Traversal::getParentLink(linkSubModel,uVar13);
      LVar7 = Link::getIndex(this);
      pTVar8 = LinkPositions::operator()(local_160,LVar7);
      iDynTree::Transform::Transform(local_150,pTVar8);
      pMVar9 = Model::visualSolidShapes(local_180);
      pvVar10 = ModelSolidShapes::getLinkSolidShapes(pMVar9);
      pvVar2 = (pvVar10->
               super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppSVar12 = pvVar2[LVar7].
                 super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar2[LVar7].
          super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppSVar12) {
        uVar13 = 0;
        do {
          iVar6 = (*ppSVar12[uVar13]->_vptr_SolidShape[2])();
          local_188 = (SolidShape *)CONCAT44(extraout_var,iVar6);
          pTVar8 = SolidShape::getLink_H_geometry
                             (*(SolidShape **)
                               (*(long *)&(pvVar10->
                                          super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[LVar7].
                                          super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                          ._M_impl.super__Vector_impl_data + uVar13 * 8));
          iDynTree::Transform::Transform(local_90,pTVar8);
          pSVar4 = local_188;
          iDynTree::Transform::operator*(local_f0,local_150);
          SolidShape::setLink_H_geometry(pSVar4,local_f0);
          pMVar9 = Model::visualSolidShapes(local_170);
          pvVar11 = ModelSolidShapes::getLinkSolidShapes(pMVar9);
          pvVar1 = (vector<iDynTree::SolidShape*,std::allocator<iDynTree::SolidShape*>> *)
                   (&(((pvVar11->
                       super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_178);
          iVar3._M_current = *(SolidShape ***)(pvVar1 + 8);
          if (iVar3._M_current == *(SolidShape ***)(pvVar1 + 0x10)) {
            std::vector<iDynTree::SolidShape*,std::allocator<iDynTree::SolidShape*>>::
            _M_realloc_insert<iDynTree::SolidShape*const&>(pvVar1,iVar3,&local_188);
          }
          else {
            *iVar3._M_current = local_188;
            *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
          }
          uVar13 = uVar13 + 1;
          pvVar2 = (pvVar10->
                   super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppSVar12 = pvVar2[LVar7].
                     super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)pvVar2[LVar7].
                                        super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar12
                                 >> 3));
      }
      pMVar9 = Model::collisionSolidShapes(local_180);
      pvVar10 = ModelSolidShapes::getLinkSolidShapes(pMVar9);
      pvVar2 = (pvVar10->
               super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppSVar12 = pvVar2[LVar7].
                 super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (pvVar2[LVar7].
          super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppSVar12) {
        uVar13 = 0;
        do {
          iVar6 = (*ppSVar12[uVar13]->_vptr_SolidShape[2])();
          local_188 = (SolidShape *)CONCAT44(extraout_var_00,iVar6);
          pTVar8 = SolidShape::getLink_H_geometry
                             (*(SolidShape **)
                               (*(long *)&(pvVar10->
                                          super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[LVar7].
                                          super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                          ._M_impl.super__Vector_impl_data + uVar13 * 8));
          iDynTree::Transform::Transform(local_90,pTVar8);
          pSVar4 = local_188;
          iDynTree::Transform::operator*(local_f0,local_150);
          SolidShape::setLink_H_geometry(pSVar4,local_f0);
          pMVar9 = Model::collisionSolidShapes(local_170);
          pvVar11 = ModelSolidShapes::getLinkSolidShapes(pMVar9);
          pvVar1 = (vector<iDynTree::SolidShape*,std::allocator<iDynTree::SolidShape*>> *)
                   (&(((pvVar11->
                       super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                     )._M_impl.super__Vector_impl_data._M_start + local_178);
          iVar3._M_current = *(SolidShape ***)(pvVar1 + 8);
          if (iVar3._M_current == *(SolidShape ***)(pvVar1 + 0x10)) {
            std::vector<iDynTree::SolidShape*,std::allocator<iDynTree::SolidShape*>>::
            _M_realloc_insert<iDynTree::SolidShape*const&>(pvVar1,iVar3,&local_188);
          }
          else {
            *iVar3._M_current = local_188;
            *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
          }
          uVar13 = uVar13 + 1;
          pvVar2 = (pvVar10->
                   super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppSVar12 = pvVar2[LVar7].
                     super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)pvVar2[LVar7].
                                        super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar12
                                 >> 3));
      }
      linkSubModel = local_168;
      uVar13 = local_158 + 1;
      uVar5 = Traversal::getNrOfVisitedLinks(local_168);
    } while (uVar13 < uVar5);
  }
  return;
}

Assistant:

void reducedModelAddSolidShapes(const Model& fullModel,
                                      Model& reducedModel,
                                const std::string linkInReducedModel,
                                const Traversal& linkSubModel,
                                const FreeFloatingPos& pos,
                                const LinkPositions& subModelBase_X_link)
{
    LinkIndex subModelBaseIndexInReducedModel = reducedModel.getLinkIndex(linkInReducedModel);

    // All the geometries collected in the traversal are lumped into the base link
    for(unsigned int traversalEl=0; traversalEl < linkSubModel.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = linkSubModel.getLink(traversalEl);
        LinkConstPtr parentLink  = linkSubModel.getParentLink(traversalEl);

        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        Transform subModelBase_H_visitedLink     = subModelBase_X_link(visitedLinkIndex);

        // Add visual shapes to the new lumped link, i.e. the subModelBase
        auto& visualSolidShapes = fullModel.visualSolidShapes().getLinkSolidShapes();
        for(int shapeIdx=0; shapeIdx < visualSolidShapes[visitedLinkIndex].size(); shapeIdx++)
        {
            // Clone the shape
            SolidShape * copiedShape = visualSolidShapes[visitedLinkIndex][shapeIdx]->clone();

            // Update shape transform from the old link to the new link
            Transform visitedLink_H_shape = visualSolidShapes[visitedLinkIndex][shapeIdx]->getLink_H_geometry();
            copiedShape->setLink_H_geometry(subModelBase_H_visitedLink * visitedLink_H_shape);

            // Ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            reducedModel.visualSolidShapes().getLinkSolidShapes()[subModelBaseIndexInReducedModel].push_back(copiedShape);
        }

        // Add collision shapes to the new lumped link, i.e. the subModelBase
        auto& collisionSolidShapes = fullModel.collisionSolidShapes().getLinkSolidShapes();
        for(int shapeIdx=0; shapeIdx < collisionSolidShapes[visitedLinkIndex].size(); shapeIdx++)
        {
            // Clone the shape : ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            SolidShape * copiedShape = collisionSolidShapes[visitedLinkIndex][shapeIdx]->clone();

            // Update shape transform from the old link to the new link
            Transform visitedLink_H_shape = collisionSolidShapes[visitedLinkIndex][shapeIdx]->getLink_H_geometry();
            copiedShape->setLink_H_geometry(subModelBase_H_visitedLink*visitedLink_H_shape);

            // Ownership of the new pointer is transfered to the ModelSolidShapes class
            // (it will be eventually deleted by the close() method
            reducedModel.collisionSolidShapes().getLinkSolidShapes()[subModelBaseIndexInReducedModel].push_back(copiedShape);
        }
    }

}